

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  layer_destroyer_func in_RCX;
  layer_creator_func in_RDX;
  uint in_ESI;
  long in_RDI;
  void *in_R8;
  custom_layer_registry_entry dummy;
  int custom_index;
  int local_4;
  
  uVar1 = in_ESI & 0xfffffeff;
  if (in_ESI == uVar1) {
    fprintf(_stderr,"can not register build-in layer index %d",(ulong)uVar1);
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  else {
    sVar2 = std::
            vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
            ::size((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                    *)(*(long *)(in_RDI + 0x48) + 0x98));
    if ((int)sVar2 <= (int)uVar1) {
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                *)0x0,0,(value_type *)0x0);
    }
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    if (pvVar3->creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d",(ulong)uVar1);
      fprintf(_stderr,"\n");
    }
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar3->creator = in_RDX;
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar3->destroyer = in_RCX;
    pvVar3 = std::
             vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ::operator[]((vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                           *)(*(long *)(in_RDI + 0x48) + 0x98),(long)(int)uVar1);
    pvVar3->userdata = in_R8;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("can not register build-in layer index %d", custom_index);
        return -1;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}